

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyFinalize(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  size_t sVar4;
  undefined8 *in_FS_OFFSET;
  size_t currentFinalizableObjectCount;
  Recycler *this_local;
  
  BVar3 = IsMarkState(this);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2445,"(!this->IsMarkState())","!this->IsMarkState()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  sVar4 = HeapInfoManager::GetFinalizeCount(&this->autoHeap);
  if (sVar4 != (this->collectionStats).finalizeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2449,
                       "(currentFinalizableObjectCount == this->collectionStats.finalizeCount)",
                       "currentFinalizableObjectCount == this->collectionStats.finalizeCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
Recycler::VerifyFinalize()
{
    // We can't check this if we are marking
    Assert(!this->IsMarkState());

    size_t currentFinalizableObjectCount = this->autoHeap.GetFinalizeCount();
#if DBG
    Assert(currentFinalizableObjectCount == this->collectionStats.finalizeCount);
#else
    if (currentFinalizableObjectCount != >this->collectionStats.finalizeCount)
    {
        Output::Print(_u("ERROR: Recycler dropped some finalizable objects"));
        DebugBreak();
    }
#endif
}